

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_std::utf8_numpunct_from_wide::do_falsename_abi_cxx11_
          (string *__return_storage_ptr__,utf8_numpunct_from_wide *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->falsename_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string do_falsename() const
    {
        return falsename_;
    }